

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cut.cpp
# Opt level: O1

longlong dinic_flow(int s,int t)

{
  bool bVar1;
  int iVar2;
  longlong flow;
  long lVar3;
  
  lVar3 = 0;
  while( true ) {
    if ((anonymous_namespace)::dis != DAT_00119278) {
      memset((anonymous_namespace)::dis,0xff,
             ((long)DAT_00119278 + (-4 - (long)(anonymous_namespace)::dis) & 0xfffffffffffffffcU) +
             4);
    }
    bVar1 = bfs_dinic(s,t);
    if (!bVar1) break;
    if ((anonymous_namespace)::ptr != DAT_00119290) {
      memset((anonymous_namespace)::ptr,0,
             ((long)DAT_00119290 + (-4 - (long)(anonymous_namespace)::ptr) & 0xfffffffffffffffcU) +
             4);
    }
    do {
      iVar2 = dfs_dinic(s,t,1000000000);
      lVar3 = lVar3 + iVar2;
    } while (iVar2 != 0);
  }
  return lVar3;
}

Assistant:

long long dinic_flow(int s, int t) {
    long long flow = 0;
     
    while (true) {
        fill(dis.begin(), dis.end(), -1);
        
        if (!bfs_dinic(s, t)) {
            break;
        }
        
        fill(ptr.begin(), ptr.end(), 0);
        
        while (int pushed = dfs_dinic(s, t, INF)) {
            flow += pushed;
        }
    }
    return flow;
}